

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

int __thiscall ON_Xform::SignOfDeterminant(ON_Xform *this,bool bFastTest)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double det;
  double min_pivot;
  double dStack_28;
  int s;
  double x;
  ON_Xform *pOStack_18;
  bool bFastTest_local;
  ON_Xform *this_local;
  
  if ((bFastTest) &&
     ((((((this->m_xform[3][0] == 0.0 && (!NAN(this->m_xform[3][0]))) &&
         (pdVar1 = this->m_xform[3] + 1, *pdVar1 == 0.0)) &&
        ((!NAN(*pdVar1) && (pdVar1 = this->m_xform[3] + 2, *pdVar1 == 0.0)))) && (!NAN(*pdVar1))) ||
      (((pdVar1 = this->m_xform[0] + 3, *pdVar1 == 0.0 && (!NAN(*pdVar1))) &&
       ((pdVar1 = this->m_xform[1] + 3, *pdVar1 == 0.0 &&
        (((!NAN(*pdVar1) && (pdVar1 = this->m_xform[2] + 3, *pdVar1 == 0.0)) && (!NAN(*pdVar1)))))))
      )))) {
    pdVar1 = this->m_xform[3] + 3;
    if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
      return 0;
    }
    dStack_28 = this->m_xform[0][2] *
                (this->m_xform[1][0] * this->m_xform[2][1] +
                -(this->m_xform[1][1] * this->m_xform[2][0])) +
                this->m_xform[0][0] *
                (this->m_xform[1][1] * this->m_xform[2][2] +
                -(this->m_xform[1][2] * this->m_xform[2][1])) +
                this->m_xform[0][1] *
                (this->m_xform[1][2] * this->m_xform[2][0] +
                -(this->m_xform[1][0] * this->m_xform[2][2]));
    if ((dStack_28 == 0.0) && (!NAN(dStack_28))) {
      return 0;
    }
    if (1e-08 < ABS(dStack_28)) {
      iVar2 = 1;
      if (dStack_28 < 0.0) {
        iVar2 = -1;
      }
      iVar3 = 1;
      if (this->m_xform[3][3] < 0.0) {
        iVar3 = -1;
      }
      return iVar2 * iVar3;
    }
  }
  det = 0.0;
  x._7_1_ = bFastTest;
  pOStack_18 = this;
  dVar4 = Determinant(this,&det);
  if ((ABS(det) <= 2.3283064365386963e-10) || (ABS(dVar4) <= 2.3283064365386963e-10)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
    if (dVar4 < 0.0) {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ON_Xform::SignOfDeterminant(bool bFastTest) const
{
  if (bFastTest)
  {
    if (
      (0.0 == m_xform[3][0] && 0.0 == m_xform[3][1] && 0.0 == m_xform[3][2])
      ||
      (0.0 == m_xform[0][3] && 0.0 == m_xform[1][3] && 0.0 == m_xform[2][3])
      )
    {
      // vast majority of the 4x4 cases in practice.

      if (0.0 == m_xform[3][3])
      {
        return 0; // 100% accurate result.
      }

      // Use the simple 3x3 formula with the fewest flops.
      const double x
        = m_xform[0][0] * (m_xform[1][1] * m_xform[2][2] - m_xform[1][2] * m_xform[2][1])
        + m_xform[0][1] * (m_xform[1][2] * m_xform[2][0] - m_xform[1][0] * m_xform[2][2])
        + m_xform[0][2] * (m_xform[1][0] * m_xform[2][1] - m_xform[1][1] * m_xform[2][0]);

      if (0.0 == x)
      {
        // It is very likely we had a simple case and, mathematically, det = 0.
        // (not a 100% safe assumption, but good enough for bFastTest = true case).
        return 0;
      }

      if (fabs(x) > 1e-8)
      {
        // x is big enough that it's very likely the sign is mathematically correct.
        // (not a 100% safe assumption, but good enough for bFastTest = true case).
        const int s = ((x < 0.0) ? -1 : 1) * ((m_xform[3][3] < 0.0) ? -1 : 1);
        return s;
      }
    }
  }

  // do it a very slow and careful way
  double min_pivot = 0.0;
  const double det = this->Determinant(&min_pivot);
  if (fabs(min_pivot) > ON_ZERO_TOLERANCE && fabs(det) > ON_ZERO_TOLERANCE)
  {
    return (det < 0.0) ? -1 : 1;
  }

  return 0;
}